

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O3

MppBufferGroupImpl * mpp_buffer_get_misc_group(MppBufferMode mode,MppBufferType type)

{
  RK_U32 RVar1;
  int iVar2;
  pthread_mutex_t *__mutex;
  MppBufferService *pMVar3;
  hlist_node *phVar4;
  MppBufferGroupImpl *pMVar5;
  char *pcVar6;
  char *pcVar7;
  MppBufferType MVar8;
  char tag [32];
  char local_48 [32];
  
  MVar8 = type & 0xffff;
  if (MVar8 == MPP_BUFFER_TYPE_NORMAL) {
    pMVar5 = (MppBufferGroupImpl *)0x0;
  }
  else {
    if (((1 < (int)mode) &&
        (_mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,
                    "mode < MPP_BUFFER_MODE_BUTT","mpp_buffer_get_misc_group",0x361),
        (mpp_debug._3_1_ & 0x10) != 0)) ||
       ((MPP_BUFFER_TYPE_DMA_HEAP < MVar8 &&
        (_mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,
                    "buf_type < MPP_BUFFER_TYPE_BUTT","mpp_buffer_get_misc_group",0x362),
        (mpp_debug._3_1_ & 0x10) != 0)))) {
      abort();
    }
    __mutex = (pthread_mutex_t *)MppBufferService::get_lock();
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock(__mutex);
    }
    pMVar3 = MppBufferService::get_instance();
    RVar1 = MppBufferService::get_misc(pMVar3,mode,type);
    if (RVar1 == 0) {
      builtin_strncpy(local_48,"misc",5);
      pcVar7 = "na";
      if (MVar8 == MPP_BUFFER_TYPE_DRM) {
        pcVar7 = "drm";
      }
      pcVar6 = "ion";
      if (MVar8 != MPP_BUFFER_TYPE_ION) {
        pcVar6 = pcVar7;
      }
      iVar2 = snprintf(local_48 + 4,0x1c,"_%s",pcVar6);
      pcVar7 = "ext";
      if (mode == MPP_BUFFER_INTERNAL) {
        pcVar7 = "int";
      }
      snprintf(local_48 + (long)iVar2 + 4,0x1c - (long)iVar2,"_%s",pcVar7);
      pMVar3 = MppBufferService::get_instance();
      pMVar5 = MppBufferService::get_group(pMVar3,local_48,"mpp_buffer_get_misc_group",mode,type,1);
    }
    else {
      pMVar3 = MppBufferService::get_instance();
      pMVar5 = (MppBufferGroupImpl *)0x0;
      for (phVar4 = pMVar3->mHashGroup[RVar1 * 0x61c88647 >> 0x18].first;
          phVar4 != (hlist_node *)0x0; phVar4 = phVar4->next) {
        if (*(RK_U32 *)((long)&phVar4[-9].pprev + 4) == RVar1) {
          pMVar5 = (MppBufferGroupImpl *)&phVar4[-0xd].pprev;
          break;
        }
      }
    }
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_unlock(__mutex);
    }
  }
  return pMVar5;
}

Assistant:

MppBufferGroupImpl *mpp_buffer_get_misc_group(MppBufferMode mode, MppBufferType type)
{
    MppBufferGroupImpl *misc;
    RK_U32 id;
    MppBufferType buf_type;

    buf_type = (MppBufferType)(type & MPP_BUFFER_TYPE_MASK);
    if (buf_type == MPP_BUFFER_TYPE_NORMAL)
        return NULL;

    mpp_assert(mode < MPP_BUFFER_MODE_BUTT);
    mpp_assert(buf_type < MPP_BUFFER_TYPE_BUTT);

    AutoMutex auto_lock(MppBufferService::get_lock());

    id = MppBufferService::get_instance()->get_misc(mode, type);
    if (!id) {
        char tag[32];
        RK_S32 offset = 0;

        offset += snprintf(tag + offset, sizeof(tag) - offset, "misc");
        offset += snprintf(tag + offset, sizeof(tag) - offset, "_%s",
                           buf_type == MPP_BUFFER_TYPE_ION ? "ion" :
                           buf_type == MPP_BUFFER_TYPE_DRM ? "drm" : "na");
        offset += snprintf(tag + offset, sizeof(tag) - offset, "_%s",
                           mode == MPP_BUFFER_INTERNAL ? "int" : "ext");

        misc = MppBufferService::get_instance()->get_group(tag, __FUNCTION__, mode, type, 1);
    } else
        misc = MppBufferService::get_instance()->get_group_by_id(id);

    return misc;
}